

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O3

void __thiscall TextBuffer::set_text(TextBuffer *this,u16string *new_text)

{
  pointer pcVar1;
  Range old_range;
  u16string local_50;
  Point local_30;
  Point local_28;
  
  Point::Point(&local_30,0,0);
  local_28 = this->top_layer->extent_;
  pcVar1 = (new_text->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::u16string::_M_construct<char16_t*>
            ((u16string *)&local_50,pcVar1,pcVar1 + new_text->_M_string_length);
  old_range.end = local_28;
  old_range.start = local_30;
  set_text_in_range(this,old_range,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity * 2 + 2);
  }
  return;
}

Assistant:

void TextBuffer::set_text(const u16string &new_text) {
  set_text_in_range(Range{Point(0, 0), extent()}, u16string(new_text));
}